

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O0

PropertyGuardEntry * __thiscall
ThreadContext::EnsurePropertyGuardEntry
          (ThreadContext *this,PropertyRecord *propertyRecord,bool *foundExistingEntry)

{
  PropertyGuardEntry *this_00;
  bool bVar1;
  RecyclableData *pRVar2;
  Recycler *pRVar3;
  PropertyGuardEntry *this_01;
  RecyclerWeakReference<const_Js::PropertyRecord> *weakRef;
  TrackAllocData local_58;
  PropertyGuardEntry *local_30;
  PropertyGuardEntry *entry;
  PropertyGuardDictionary *guards;
  bool *foundExistingEntry_local;
  PropertyRecord *propertyRecord_local;
  ThreadContext *this_local;
  
  guards = (PropertyGuardDictionary *)foundExistingEntry;
  foundExistingEntry_local = (bool *)propertyRecord;
  propertyRecord_local = (PropertyRecord *)this;
  pRVar2 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(&this->recyclableData)
  ;
  entry = (PropertyGuardEntry *)&pRVar2->propertyGuards;
  local_30 = (PropertyGuardEntry *)0x0;
  bVar1 = JsUtil::
          WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
          ::TryGetValue((WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
                         *)entry,(PropertyRecord *)foundExistingEntry_local,&local_30);
  *(bool *)&guards->size = bVar1;
  if ((guards->size & 1) == 0) {
    pRVar3 = GetRecycler(this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_58,(type_info *)&PropertyGuardEntry::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ThreadContext.cpp"
               ,0xdaa);
    pRVar3 = Memory::Recycler::TrackAllocInfo(pRVar3,&local_58);
    this_01 = (PropertyGuardEntry *)new<Memory::Recycler>(0x48,pRVar3,0x43c4b0);
    pRVar3 = GetRecycler(this);
    PropertyGuardEntry::PropertyGuardEntry(this_01,pRVar3);
    this_00 = entry;
    local_30 = this_01;
    weakRef = CreatePropertyRecordWeakRef(this,(PropertyRecord *)foundExistingEntry_local);
    JsUtil::
    WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
    ::UncheckedAdd((WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
                    *)this_00,weakRef,local_30);
  }
  return local_30;
}

Assistant:

ThreadContext::PropertyGuardEntry*
ThreadContext::EnsurePropertyGuardEntry(const Js::PropertyRecord* propertyRecord, bool& foundExistingEntry)
{
    PropertyGuardDictionary &guards = this->recyclableData->propertyGuards;
    PropertyGuardEntry* entry = nullptr;

    foundExistingEntry = guards.TryGetValue(propertyRecord, &entry);
    if (!foundExistingEntry)
    {
        entry = RecyclerNew(GetRecycler(), PropertyGuardEntry, GetRecycler());

        guards.UncheckedAdd(CreatePropertyRecordWeakRef(propertyRecord), entry);
    }

    return entry;
}